

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall YAML::Parser::HandleDirective(Parser *this,Token *token)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  Token *in_stack_000000a8;
  Parser *in_stack_000000b0;
  Token *in_stack_000002b8;
  Parser *in_stack_000002c0;
  
  bVar1 = std::operator==(in_RSI,in_RDI);
  if (bVar1) {
    HandleYamlDirective(in_stack_000002c0,in_stack_000002b8);
  }
  else {
    bVar1 = std::operator==(in_RSI,in_RDI);
    if (bVar1) {
      HandleTagDirective(in_stack_000000b0,in_stack_000000a8);
    }
  }
  return;
}

Assistant:

void Parser::HandleDirective(const Token& token) {
  if (token.value == "YAML") {
    HandleYamlDirective(token);
  } else if (token.value == "TAG") {
    HandleTagDirective(token);
  }
}